

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O2

int __thiscall ncnn::ParamDict::load_param_bin(ParamDict *this,DataReader *dr)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  ulong uVar4;
  long lVar5;
  long lVar6;
  char *__format;
  int id;
  allocator_type local_4d;
  int len;
  vector<char,_std::allocator<char>_> tmpstr;
  
  clear(this);
  id = 0;
  iVar2 = (*dr->_vptr_DataReader[3])(dr,&id,4);
  lVar5 = CONCAT44(extraout_var,iVar2);
  if (lVar5 == 4) {
    do {
      uVar4 = (ulong)id;
      if (uVar4 == 0xffffffffffffff17) {
        return 0;
      }
      if (id < -0x5b67) {
        uVar3 = -id - 0x5b68;
        uVar4 = (ulong)uVar3;
        bVar1 = (uint)id < 0xffffa479;
        id = uVar3;
        if (bVar1) goto LAB_0013721b;
        len = 0;
        iVar2 = (*dr->_vptr_DataReader[3])(dr,&len,4);
        lVar5 = CONCAT44(extraout_var_00,iVar2);
        if (lVar5 != 4) {
LAB_0013724b:
          __format = "ParamDict read array length failed %zd";
          goto LAB_001372a0;
        }
        if (0xff < len) {
          fprintf(_stderr,"string too long (id=%d)",(ulong)(uint)id);
          goto LAB_001372aa;
        }
        lVar5 = (long)((len + 3) / 4);
        lVar6 = lVar5 * 4;
        std::vector<char,_std::allocator<char>_>::vector(&tmpstr,lVar5 * 4 + 1,&local_4d);
        iVar2 = (*dr->_vptr_DataReader[3])
                          (dr,CONCAT44(tmpstr.super__Vector_base<char,_std::allocator<char>_>.
                                       _M_impl.super__Vector_impl_data._M_start._4_4_,
                                       (int)tmpstr.super__Vector_base<char,_std::allocator<char>_>.
                                            _M_impl.super__Vector_impl_data._M_start),lVar6);
        lVar5 = CONCAT44(extraout_var_01,iVar2);
        if (lVar5 == lVar6) {
          *(undefined1 *)
           (CONCAT44(tmpstr.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start._4_4_,
                     (int)tmpstr.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start) + lVar6) = 0;
          std::__cxx11::string::assign((char *)&this->d->params[id].s);
          this->d->params[id].type = 7;
        }
        else {
          fprintf(_stderr,"ParamDict read string failed %zd",lVar5);
          fputc(10,_stderr);
        }
        std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                  (&tmpstr.super__Vector_base<char,_std::allocator<char>_>);
        if (lVar5 != lVar6) {
          return -1;
        }
      }
      else if (id < -0x5b03) {
        uVar3 = -id - 0x5b04;
        uVar4 = (ulong)uVar3;
        bVar1 = id < -0x5b23;
        id = uVar3;
        if (bVar1) {
LAB_0013721b:
          fprintf(_stderr,"id < NCNN_MAX_PARAM_COUNT failed (id=%d, NCNN_MAX_PARAM_COUNT=%d)",uVar4,
                  0x20);
          goto LAB_001372aa;
        }
        tmpstr.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start._0_4_ = 0;
        iVar2 = (*dr->_vptr_DataReader[3])(dr,&tmpstr,4);
        lVar5 = CONCAT44(extraout_var_02,iVar2);
        if (lVar5 != 4) goto LAB_0013724b;
        Mat::create(&this->d->params[id].v,
                    (int)tmpstr.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start,4,(Allocator *)0x0);
        iVar2 = (*dr->_vptr_DataReader[3])
                          (dr,this->d->params[id].v.data,
                           (long)(int)tmpstr.super__Vector_base<char,_std::allocator<char>_>._M_impl
                                      .super__Vector_impl_data._M_start << 2);
        lVar5 = CONCAT44(extraout_var_03,iVar2);
        if (lVar5 != (long)(int)tmpstr.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start * 4) {
          __format = "ParamDict read array element failed %zd";
          goto LAB_001372a0;
        }
        this->d->params[id].type = 4;
      }
      else {
        if (0x1f < id) goto LAB_0013721b;
        iVar2 = (*dr->_vptr_DataReader[3])(dr,&this->d->params[uVar4].field_1,4);
        lVar5 = CONCAT44(extraout_var_04,iVar2);
        if (lVar5 != 4) {
          __format = "ParamDict read value failed %zd";
          goto LAB_001372a0;
        }
        this->d->params[id].type = 1;
      }
      iVar2 = (*dr->_vptr_DataReader[3])(dr,&id,4);
      lVar5 = CONCAT44(extraout_var_05,iVar2);
    } while (lVar5 == 4);
    __format = "ParamDict read EOP failed %zd";
  }
  else {
    __format = "ParamDict read id failed %zd";
  }
LAB_001372a0:
  fprintf(_stderr,__format,lVar5);
LAB_001372aa:
  fputc(10,_stderr);
  return -1;
}

Assistant:

int ParamDict::load_param_bin(const DataReader& dr)
{
    clear();

    //     binary 0
    //     binary 100
    //     binary 1
    //     binary 1.250000
    //     binary 3 | array_bit
    //     binary 5
    //     binary 0.1
    //     binary 0.2
    //     binary 0.4
    //     binary 0.8
    //     binary 1.0
    //     binary -233(EOP)

    int id = 0;
    size_t nread;
    nread = dr.read(&id, sizeof(int));
    if (nread != sizeof(int))
    {
        NCNN_LOGE("ParamDict read id failed %zd", nread);
        return -1;
    }

#if __BIG_ENDIAN__
    swap_endianness_32(&id);
#endif

    while (id != -233)
    {
        bool is_array = id <= -23300;
        bool is_string = id <= -23400;
        if (is_string)
        {
            id = -id - 23400;
        }
        else if (is_array)
        {
            id = -id - 23300;
        }

        if (id >= NCNN_MAX_PARAM_COUNT)
        {
            NCNN_LOGE("id < NCNN_MAX_PARAM_COUNT failed (id=%d, NCNN_MAX_PARAM_COUNT=%d)", id, NCNN_MAX_PARAM_COUNT);
            return -1;
        }

        if (is_string)
        {
            int len = 0;
            nread = dr.read(&len, sizeof(int));
            if (nread != sizeof(int))
            {
                NCNN_LOGE("ParamDict read array length failed %zd", nread);
                return -1;
            }

#if __BIG_ENDIAN__
            swap_endianness_32(&len);
#endif

            if (len > 255)
            {
                NCNN_LOGE("string too long (id=%d)", id);
                return -1;
            }

            size_t len_padded = (len + 3) / 4 * 4;
            std::vector<char> tmpstr(len_padded + 1);

            char* ptr = (char*)tmpstr.data();
            nread = dr.read(ptr, len_padded);
            if (nread != len_padded)
            {
                NCNN_LOGE("ParamDict read string failed %zd", nread);
                return -1;
            }

            tmpstr[len_padded] = '\0';

            d->params[id].s = tmpstr.data();

            d->params[id].type = 7;
        }
        else if (is_array)
        {
            int len = 0;
            nread = dr.read(&len, sizeof(int));
            if (nread != sizeof(int))
            {
                NCNN_LOGE("ParamDict read array length failed %zd", nread);
                return -1;
            }

#if __BIG_ENDIAN__
            swap_endianness_32(&len);
#endif

            d->params[id].v.create(len);

            float* ptr = d->params[id].v;
            nread = dr.read(ptr, sizeof(float) * len);
            if (nread != sizeof(float) * len)
            {
                NCNN_LOGE("ParamDict read array element failed %zd", nread);
                return -1;
            }

#if __BIG_ENDIAN__
            for (int i = 0; i < len; i++)
            {
                swap_endianness_32(ptr + i);
            }
#endif

            d->params[id].type = 4;
        }
        else
        {
            nread = dr.read(&d->params[id].f, sizeof(float));
            if (nread != sizeof(float))
            {
                NCNN_LOGE("ParamDict read value failed %zd", nread);
                return -1;
            }

#if __BIG_ENDIAN__
            swap_endianness_32(&d->params[id].f);
#endif

            d->params[id].type = 1;
        }

        nread = dr.read(&id, sizeof(int));
        if (nread != sizeof(int))
        {
            NCNN_LOGE("ParamDict read EOP failed %zd", nread);
            return -1;
        }

#if __BIG_ENDIAN__
        swap_endianness_32(&id);
#endif
    }

    return 0;
}